

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeLiteGenerator.cxx
# Opt level: O0

void __thiscall cmExtraCodeLiteGenerator::Generate(cmExtraCodeLiteGenerator *this)

{
  bool bVar1;
  int iVar2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>_>
  *pmVar3;
  char *__s2;
  pointer ppVar4;
  const_reference ppcVar5;
  char *pcVar6;
  cmSystemTools *this_00;
  ostream *poVar7;
  char *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  string local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  undefined1 local_408 [8];
  string filename;
  undefined1 local_3e0 [8];
  string projectName;
  undefined1 local_3b8 [8];
  string outputDir;
  cmMakefile *mf_1;
  _Self local_388;
  const_iterator it_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  string local_340;
  cmMakefile *local_320;
  cmMakefile *mf;
  _Self local_310;
  const_iterator it;
  undefined1 local_2f8 [8];
  cmGeneratedFileStream fout;
  string lprjdebug;
  string workspaceSourcePath;
  string workspaceFileName;
  string workspaceOutputDir;
  string workspaceProjectName;
  cmExtraCodeLiteGenerator *this_local;
  
  std::__cxx11::string::string((string *)(workspaceOutputDir.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(workspaceFileName.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(workspaceSourcePath.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(lprjdebug.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&fout.field_0x240);
  cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_2f8);
  pmVar3 = cmGlobalGenerator::GetProjectMap_abi_cxx11_
                     ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator);
  local_310._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>_>
       ::begin(pmVar3);
  while( true ) {
    pmVar3 = cmGlobalGenerator::GetProjectMap_abi_cxx11_
                       ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator);
    mf = (cmMakefile *)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>_>
         ::end(pmVar3);
    bVar1 = std::operator!=(&local_310,(_Self *)&mf);
    if (!bVar1) break;
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>
             ::operator->(&local_310);
    ppcVar5 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                        (&ppVar4->second,0);
    local_320 = cmLocalGenerator::GetMakefile(*ppcVar5);
    GetConfigurationName_abi_cxx11_(&local_340,this,local_320);
    std::__cxx11::string::operator=((string *)&this->ConfigName,(string *)&local_340);
    std::__cxx11::string::~string((string *)&local_340);
    pcVar6 = cmMakefile::GetCurrentBinaryDirectory(local_320);
    __s2 = cmMakefile::GetHomeOutputDirectory(local_320);
    iVar2 = strcmp(pcVar6,__s2);
    if (iVar2 == 0) {
      pcVar6 = cmMakefile::GetCurrentBinaryDirectory(local_320);
      std::__cxx11::string::operator=((string *)(workspaceFileName.field_2._M_local_buf + 8),pcVar6)
      ;
      pcVar6 = cmMakefile::GetProjectName(local_320);
      std::__cxx11::string::operator=
                ((string *)(workspaceOutputDir.field_2._M_local_buf + 8),pcVar6);
      pcVar6 = cmMakefile::GetHomeDirectory(local_320);
      std::__cxx11::string::operator=((string *)(lprjdebug.field_2._M_local_buf + 8),pcVar6);
      std::operator+(&local_360,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&workspaceFileName.field_2 + 8),"/");
      std::__cxx11::string::operator=
                ((string *)(workspaceSourcePath.field_2._M_local_buf + 8),(string *)&local_360);
      std::__cxx11::string::~string((string *)&local_360);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it_1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&workspaceOutputDir.field_2 + 8),".workspace");
      std::__cxx11::string::operator+=
                ((string *)(workspaceSourcePath.field_2._M_local_buf + 8),(string *)&it_1);
      std::__cxx11::string::~string((string *)&it_1);
      pcVar6 = cmMakefile::GetCurrentBinaryDirectory(local_320);
      std::__cxx11::string::operator=((string *)&this->WorkspacePath,pcVar6);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      in_RCX = (char *)0x0;
      cmGeneratedFileStream::Open((cmGeneratedFileStream *)local_2f8,pcVar6,false,false);
      poVar7 = std::operator<<((ostream *)local_2f8,
                               "<?xml version=\"1.0\" encoding=\"utf-8\"?>\n<CodeLite_Workspace Name=\""
                              );
      poVar7 = std::operator<<(poVar7,(string *)(workspaceOutputDir.field_2._M_local_buf + 8));
      std::operator<<(poVar7,"\" >\n");
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>
    ::operator++(&local_310);
  }
  pmVar3 = cmGlobalGenerator::GetProjectMap_abi_cxx11_
                     ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator);
  local_388._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>_>
       ::begin(pmVar3);
  while( true ) {
    pmVar3 = cmGlobalGenerator::GetProjectMap_abi_cxx11_
                       ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator);
    mf_1 = (cmMakefile *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>_>
           ::end(pmVar3);
    bVar1 = std::operator!=(&local_388,(_Self *)&mf_1);
    if (!bVar1) break;
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>
             ::operator->(&local_388);
    ppcVar5 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                        (&ppVar4->second,0);
    outputDir.field_2._8_8_ = cmLocalGenerator::GetMakefile(*ppcVar5);
    pcVar6 = cmMakefile::GetCurrentBinaryDirectory((cmMakefile *)outputDir.field_2._8_8_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_3b8,pcVar6,(allocator *)(projectName.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(projectName.field_2._M_local_buf + 0xf));
    pcVar6 = cmMakefile::GetProjectName((cmMakefile *)outputDir.field_2._8_8_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_3e0,pcVar6,(allocator *)(filename.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(filename.field_2._M_local_buf + 0xf));
    std::operator+(&local_448,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b8,
                   "/");
    std::operator+(&local_428,&local_448,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_408,
                   &local_428,".project");
    std::__cxx11::string::~string((string *)&local_428);
    std::__cxx11::string::~string((string *)&local_448);
    this_00 = (cmSystemTools *)std::__cxx11::string::c_str();
    pcVar6 = (char *)std::__cxx11::string::c_str();
    cmSystemTools::RelativePath_abi_cxx11_(&local_468,this_00,pcVar6,in_RCX);
    std::__cxx11::string::operator=((string *)local_408,(string *)&local_468);
    std::__cxx11::string::~string((string *)&local_468);
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>
             ::operator->(&local_388);
    CreateProjectFile(this,&ppVar4->second);
    poVar7 = std::operator<<((ostream *)local_2f8,"  <Project Name=\"");
    poVar7 = std::operator<<(poVar7,(string *)local_3e0);
    poVar7 = std::operator<<(poVar7,"\" Path=\"");
    poVar7 = std::operator<<(poVar7,(string *)local_408);
    std::operator<<(poVar7,"\" Active=\"No\"/>\n");
    std::operator+(&local_4e8,"<Project Name=\"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e0);
    std::operator+(&local_4c8,&local_4e8,"\" ConfigName=\"");
    std::operator+(&local_4a8,&local_4c8,&this->ConfigName);
    std::operator+(&local_488,&local_4a8,"\"/>\n");
    std::__cxx11::string::operator+=((string *)&fout.field_0x240,(string *)&local_488);
    std::__cxx11::string::~string((string *)&local_488);
    std::__cxx11::string::~string((string *)&local_4a8);
    std::__cxx11::string::~string((string *)&local_4c8);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::__cxx11::string::~string((string *)local_408);
    std::__cxx11::string::~string((string *)local_3e0);
    std::__cxx11::string::~string((string *)local_3b8);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>
    ::operator++(&local_388);
  }
  poVar7 = std::operator<<((ostream *)local_2f8,
                           "  <BuildMatrix>\n    <WorkspaceConfiguration Name=\"");
  poVar7 = std::operator<<(poVar7,(string *)&this->ConfigName);
  poVar7 = std::operator<<(poVar7,"\" Selected=\"yes\">\n      ");
  poVar7 = std::operator<<(poVar7,(string *)&fout.field_0x240);
  std::operator<<(poVar7,"    </WorkspaceConfiguration>\n  </BuildMatrix>\n</CodeLite_Workspace>\n")
  ;
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_2f8);
  std::__cxx11::string::~string((string *)&fout.field_0x240);
  std::__cxx11::string::~string((string *)(lprjdebug.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(workspaceSourcePath.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(workspaceFileName.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(workspaceOutputDir.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmExtraCodeLiteGenerator::Generate()
{
  // Hold root tree information for creating the workspace
  std::string workspaceProjectName;
  std::string workspaceOutputDir;
  std::string workspaceFileName;
  std::string workspaceSourcePath;
  std::string lprjdebug;

  cmGeneratedFileStream fout;

  // loop projects and locate the root project.
  // and extract the information for creating the worspace
  for (std::map<std::string, std::vector<cmLocalGenerator*> >::const_iterator
       it = this->GlobalGenerator->GetProjectMap().begin();
       it!= this->GlobalGenerator->GetProjectMap().end();
       ++it)
    {
    const cmMakefile* mf =it->second[0]->GetMakefile();
    this->ConfigName = GetConfigurationName( mf );

    if (strcmp(mf->GetCurrentBinaryDirectory(),
               mf->GetHomeOutputDirectory()) == 0)
      {
      workspaceOutputDir   = mf->GetCurrentBinaryDirectory();
      workspaceProjectName = mf->GetProjectName();
      workspaceSourcePath  = mf->GetHomeDirectory();
      workspaceFileName    = workspaceOutputDir+"/";
      workspaceFileName   += workspaceProjectName + ".workspace";
      this->WorkspacePath = mf->GetCurrentBinaryDirectory();;

      fout.Open(workspaceFileName.c_str(), false, false);
      fout << "<?xml version=\"1.0\" encoding=\"utf-8\"?>\n"
           "<CodeLite_Workspace Name=\"" << workspaceProjectName << "\" >\n";
      }
    }

  // for each sub project in the workspace create a codelite project
  for (std::map<std::string, std::vector<cmLocalGenerator*> >::const_iterator
       it = this->GlobalGenerator->GetProjectMap().begin();
       it!= this->GlobalGenerator->GetProjectMap().end();
       ++it)
    {
    // retrive project information
    const cmMakefile* mf    = it->second[0]->GetMakefile();
    std::string outputDir   = mf->GetCurrentBinaryDirectory();
    std::string projectName = mf->GetProjectName();
    std::string filename    = outputDir + "/" + projectName + ".project";

    // Make the project file relative to the workspace
    filename = cmSystemTools::RelativePath(this->WorkspacePath.c_str(),
                                          filename.c_str());

    // create a project file
    this->CreateProjectFile(it->second);
    fout << "  <Project Name=\"" << projectName << "\" Path=\""
    << filename << "\" Active=\"No\"/>\n";
    lprjdebug += "<Project Name=\"" + projectName
              + "\" ConfigName=\"" + this->ConfigName + "\"/>\n";
    }

  fout << "  <BuildMatrix>\n"
       "    <WorkspaceConfiguration Name=\""
       << this->ConfigName << "\" Selected=\"yes\">\n"
       "      " << lprjdebug << ""
       "    </WorkspaceConfiguration>\n"
       "  </BuildMatrix>\n"
       "</CodeLite_Workspace>\n";
}